

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

Symbol token_end_layout_texp(Env *env)

{
  _Bool _Var1;
  Symbol local_14;
  Env *env_local;
  
  _Var1 = valid(env,END);
  if ((_Var1) && (_Var1 = layouts_in_texp(env), _Var1)) {
    local_14 = end_layout(env,"texp");
  }
  else {
    local_14 = FAIL;
  }
  return local_14;
}

Assistant:

static Symbol token_end_layout_texp(Env *env) {
  return (valid(env, END) && layouts_in_texp(env)) ? end_layout(env, "texp") : FAIL;
}